

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O3

bool __thiscall
HACD::ICHUll::ComputePointVolume(ICHUll *this,double *totalVolume,bool markVisibleFaces)

{
  long lVar1;
  pointer *pppCVar2;
  CircularListElement<HACD::TMMTriangle> *pCVar3;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  CircularListElement<HACD::TMMVertex> *pCVar6;
  iterator __position;
  pointer ppCVar7;
  pointer ppCVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  byte bVar16;
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [64];
  CircularListElement<HACD::TMMTriangle> *f;
  CircularListElement<HACD::TMMTriangle> *local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined1 auVar22 [32];
  undefined1 auVar25 [64];
  
  pCVar3 = (this->m_mesh).m_triangles.m_head;
  auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  bVar16 = 0;
  pCVar4 = (this->m_mesh).m_vertices.m_head;
  dVar37 = (pCVar4->m_data).m_pos.m_data[0];
  dVar38 = (pCVar4->m_data).m_pos.m_data[1];
  dVar39 = (pCVar4->m_data).m_pos.m_data[2];
  *totalVolume = 0.0;
  local_50 = pCVar3;
  local_48 = dVar39;
  local_40 = dVar38;
  local_38 = dVar37;
  do {
    pCVar4 = (local_50->m_data).m_vertices[1];
    pCVar5 = (local_50->m_data).m_vertices[0];
    pCVar6 = (local_50->m_data).m_vertices[2];
    dVar9 = (pCVar4->m_data).m_pos.m_data[2] - dVar39;
    dVar10 = (pCVar4->m_data).m_pos.m_data[0] - dVar37;
    dVar11 = (pCVar4->m_data).m_pos.m_data[1] - dVar38;
    dVar12 = (pCVar6->m_data).m_pos.m_data[1] - dVar38;
    dVar13 = (pCVar6->m_data).m_pos.m_data[2] - dVar39;
    dVar14 = (pCVar6->m_data).m_pos.m_data[0] - dVar37;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar11;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar13;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar12 * dVar9;
    auVar21 = vfmsub231sd_fma(auVar36,auVar21,auVar34);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar9;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar14;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar13 * dVar10;
    auVar27 = vfmsub231sd_fma(auVar35,auVar32,auVar31);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (pCVar5->m_data).m_pos.m_data[0] - dVar37;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar27._0_8_ * ((pCVar5->m_data).m_pos.m_data[1] - dVar38);
    auVar21 = vfmadd231sd_fma(auVar28,auVar26,auVar21);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar14 * dVar11;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar10;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar12;
    auVar27 = vfmsub231sd_fma(auVar27,auVar30,auVar33);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (pCVar5->m_data).m_pos.m_data[2] - dVar39;
    auVar21 = vfmadd213sd_fma(auVar27,auVar29,auVar21);
    if (auVar21._0_8_ < -1e-09) {
      auVar21 = vandpd_avx(auVar40._0_16_,auVar21);
      bVar16 = 1;
      *totalVolume = auVar21._0_8_ + *totalVolume;
      if (markVisibleFaces) {
        (local_50->m_data).m_visible = true;
        __position._M_current =
             (this->m_trianglesToDelete).
             super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<HACD::CircularListElement<HACD::TMMTriangle>*,std::allocator<HACD::CircularListElement<HACD::TMMTriangle>*>>
          ::_M_realloc_insert<HACD::CircularListElement<HACD::TMMTriangle>*const&>
                    ((vector<HACD::CircularListElement<HACD::TMMTriangle>*,std::allocator<HACD::CircularListElement<HACD::TMMTriangle>*>>
                      *)&this->m_trianglesToDelete,__position,&local_50);
          auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar37 = local_38;
          dVar38 = local_40;
          dVar39 = local_48;
        }
        else {
          *__position._M_current = local_50;
          pppCVar2 = &(this->m_trianglesToDelete).
                      super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar2 = *pppCVar2 + 1;
        }
      }
    }
    local_50 = local_50->m_next;
  } while (local_50 != pCVar3);
  ppCVar7 = (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar8 = (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar17 = (long)ppCVar7 - (long)ppCVar8 >> 3;
  if (sVar17 == (this->m_mesh).m_triangles.m_size) {
    if (ppCVar7 != ppCVar8) {
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar23 = vpbroadcastq_avx512f();
      uVar18 = 0;
      do {
        auVar24 = vpbroadcastq_avx512f();
        auVar24 = vporq_avx512f(auVar24,auVar40);
        uVar15 = vpcmpuq_avx512f(auVar24,auVar23,2);
        auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(ppCVar8 + uVar18));
        lVar19 = (ulong)((byte)uVar15 & 1) * auVar24._0_8_;
        auVar20._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar24._8_8_;
        auVar20._0_8_ = lVar19;
        lVar1 = (ulong)((byte)(uVar15 >> 2) & 1) * auVar24._16_8_;
        auVar22._16_8_ = lVar1;
        auVar22._0_16_ = auVar20;
        auVar22._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar24._24_8_;
        auVar25._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar24._32_8_;
        auVar25._0_32_ = auVar22;
        auVar25._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar24._40_8_;
        auVar25._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar24._48_8_;
        auVar25._56_8_ = (uVar15 >> 7) * auVar24._56_8_;
        if ((uVar15 & 1) != 0) {
          *(undefined1 *)(lVar19 + 0xd0) = 0;
        }
        if ((uVar15 & 2) != 0) {
          lVar19 = vpextrq_avx(auVar20,1);
          *(undefined1 *)(lVar19 + 0xd0) = 0;
        }
        if ((uVar15 & 4) != 0) {
          *(undefined1 *)(lVar1 + 0xd0) = 0;
        }
        if ((uVar15 & 8) != 0) {
          lVar19 = vpextrq_avx(auVar22._16_16_,1);
          *(undefined1 *)(lVar19 + 0xd0) = 0;
        }
        auVar21 = vextracti32x4_avx512f(auVar25,2);
        if ((uVar15 & 0x10) != 0) {
          *(undefined1 *)(auVar21._0_8_ + 0xd0) = 0;
        }
        if ((uVar15 & 0x20) != 0) {
          lVar19 = vpextrq_avx(auVar21,1);
          *(undefined1 *)(lVar19 + 0xd0) = 0;
        }
        auVar21 = vextracti32x4_avx512f(auVar25,3);
        if ((uVar15 & 0x40) != 0) {
          *(undefined1 *)(auVar21._0_8_ + 0xd0) = 0;
        }
        if ((uVar15 & 0x80) != 0) {
          lVar19 = vpextrq_avx(auVar21,1);
          *(undefined1 *)(lVar19 + 0xd0) = 0;
        }
        uVar18 = uVar18 + 8;
      } while ((sVar17 + (sVar17 == 0) + 7 & 0xfffffffffffffff8) != uVar18);
    }
    bVar16 = 0;
  }
  if (!(bool)(!markVisibleFaces | bVar16)) {
    CircularList<HACD::TMMVertex>::Delete(&(this->m_mesh).m_vertices);
    ppCVar7 = (this->m_trianglesToDelete).
              super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_trianglesToDelete).
        super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
      (this->m_trianglesToDelete).
      super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar7;
    }
  }
  return (bool)(!markVisibleFaces | bVar16);
}

Assistant:

bool ICHUll::ComputePointVolume(double &totalVolume, bool markVisibleFaces)
    {
        // mark visible faces
        CircularListElement<TMMTriangle> * fHead = m_mesh.GetTriangles().GetHead();
        CircularListElement<TMMTriangle> * f = fHead;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * vertex0 = vertices.GetHead();
        bool visible = false;
        Vec3<double> pos0 = Vec3<double>(vertex0->GetData().m_pos.X(),
										 vertex0->GetData().m_pos.Y(),
										 vertex0->GetData().m_pos.Z());
        double vol = 0.0;
        totalVolume = 0.0;
		Vec3<double> ver0, ver1, ver2;		
        do 
        {
			ver0.X() = f->GetData().m_vertices[0]->GetData().m_pos.X();
			ver0.Y() = f->GetData().m_vertices[0]->GetData().m_pos.Y();
			ver0.Z() = f->GetData().m_vertices[0]->GetData().m_pos.Z();
			ver1.X() = f->GetData().m_vertices[1]->GetData().m_pos.X();
			ver1.Y() = f->GetData().m_vertices[1]->GetData().m_pos.Y();
			ver1.Z() = f->GetData().m_vertices[1]->GetData().m_pos.Z();
			ver2.X() = f->GetData().m_vertices[2]->GetData().m_pos.X();
			ver2.Y() = f->GetData().m_vertices[2]->GetData().m_pos.Y();
			ver2.Z() = f->GetData().m_vertices[2]->GetData().m_pos.Z();
			vol = Volume(ver0, ver1, ver2, pos0);
			if ( vol < -sc_eps)
			{
				vol = fabs(vol);
				totalVolume += vol;
				if (markVisibleFaces)
				{
					f->GetData().m_visible = true;
					m_trianglesToDelete.push_back(f);
				}
				visible = true;
			}
			f = f->GetNext();
        } 
        while (f != fHead);

		if (m_trianglesToDelete.size() == m_mesh.m_triangles.GetSize())
		{
			for(size_t i = 0; i < m_trianglesToDelete.size(); i++)
			{
				m_trianglesToDelete[i]->GetData().m_visible = false;
			}
			visible = false;
		}
        // if no faces visible from p then p is inside the hull
        if (!visible && markVisibleFaces)
        {
            vertices.Delete();
			m_trianglesToDelete.clear();
            return false;
        }
        return true;
    }